

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::JoinFilterPushdownInfo::PushInFilter
          (JoinFilterPushdownInfo *this,JoinFilterPushdownFilter *info,JoinHashTable *ht,
          PhysicalOperator *op,idx_t filter_idx,idx_t filter_col_idx)

{
  size_type __n;
  bool bVar1;
  const_reference pvVar2;
  type this_00;
  idx_t iVar3;
  TupleDataLayout *this_01;
  const_reference other;
  SelectionVector *scan_sel;
  SelectionVector *target_sel;
  DynamicTableFilterSet *this_02;
  idx_t index;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_410;
  TableFilter *local_408;
  _Head_base<0UL,_duckdb::InFilter_*,_false> local_400;
  PhysicalOperator *local_3f8;
  idx_t local_3f0;
  LogicalType local_3e8;
  LogicalType local_3d0;
  vector<duckdb::Value,_true> in_list;
  value_set_t unique_ht_values;
  Vector build_vector;
  Vector tuples_addresses;
  JoinHTScanState join_ht_state;
  
  local_3f8 = op;
  local_3f0 = filter_col_idx;
  pvVar2 = vector<unsigned_long,_true>::get<true>(&this->join_condition,filter_idx);
  __n = *pvVar2;
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&ht->data_collection);
  LogicalType::LogicalType(&local_3d0,POINTER);
  iVar3 = JoinHashTable::Count(ht);
  Vector::Vector(&tuples_addresses,&local_3d0,iVar3);
  LogicalType::~LogicalType(&local_3d0);
  iVar3 = TupleDataCollection::ChunkCount(this_00);
  JoinHTScanState::JoinHTScanState(&join_ht_state,this_00,0,iVar3,KEEP_EVERYTHING_PINNED);
  iVar3 = JoinHashTable::FillWithHTOffsets(&join_ht_state,&tuples_addresses);
  this_01 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&ht->layout_ptr);
  other = vector<duckdb::LogicalType,_true>::get<true>(&this_01->types,__n);
  LogicalType::LogicalType(&local_3e8,other);
  Vector::Vector(&build_vector,&local_3e8,iVar3);
  LogicalType::~LogicalType(&local_3e8);
  scan_sel = FlatVector::IncrementalSelectionVector();
  target_sel = FlatVector::IncrementalSelectionVector();
  TupleDataCollection::Gather
            (this_00,&tuples_addresses,scan_sel,iVar3,__n,&build_vector,target_sel,
             (optional_ptr<duckdb::Vector,_true>)0x0);
  unique_ht_values._M_h._M_buckets = &unique_ht_values._M_h._M_single_bucket;
  unique_ht_values._M_h._M_bucket_count = 1;
  unique_ht_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_ht_values._M_h._M_element_count = 0;
  unique_ht_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_ht_values._M_h._M_rehash_policy._M_next_resize = 0;
  unique_ht_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (index = 0; iVar3 != index; index = index + 1) {
    Vector::GetValue((Value *)&in_list,&build_vector,index);
    ::std::__detail::
    _Insert<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&unique_ht_values,(Value *)&in_list);
    Value::~Value((Value *)&in_list);
  }
  ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
  vector<std::__detail::_Node_iterator<duckdb::Value,true,true>,void>
            ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&in_list,
             (_Node_iterator<duckdb::Value,_true,_true>)unique_ht_values._M_h._M_before_begin._M_nxt
             ,(_Node_iterator<duckdb::Value,_true,_true>)0x0,(allocator_type *)&local_400);
  bVar1 = FilterCombiner::ContainsNull(&in_list);
  if (!bVar1) {
    bVar1 = FilterCombiner::IsDenseRange(&in_list);
    if (!bVar1) {
      make_uniq<duckdb::InFilter,duckdb::vector<duckdb::Value,true>>((duckdb *)&local_400,&in_list);
      make_uniq<duckdb::OptionalFilter,duckdb::unique_ptr<duckdb::InFilter,std::default_delete<duckdb::InFilter>,true>>
                ((duckdb *)&local_408,
                 (unique_ptr<duckdb::InFilter,_std::default_delete<duckdb::InFilter>,_true> *)
                 &local_400);
      this_02 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->(&info->dynamic_filters);
      local_410._M_head_impl = local_408;
      local_408 = (TableFilter *)0x0;
      DynamicTableFilterSet::PushFilter
                (this_02,local_3f8,local_3f0,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_410);
      if (local_410._M_head_impl != (TableFilter *)0x0) {
        (*(local_410._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_410._M_head_impl = (TableFilter *)0x0;
      if (local_408 != (TableFilter *)0x0) {
        (*local_408->_vptr_TableFilter[1])();
      }
      if (local_400._M_head_impl != (InFilter *)0x0) {
        (*((local_400._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
      }
    }
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&in_list);
  ::std::
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&unique_ht_values._M_h);
  Vector::~Vector(&build_vector);
  TupleDataScanState::~TupleDataScanState(&join_ht_state.iterator.state);
  Vector::~Vector(&tuples_addresses);
  return;
}

Assistant:

void JoinFilterPushdownInfo::PushInFilter(const JoinFilterPushdownFilter &info, JoinHashTable &ht,
                                          const PhysicalOperator &op, idx_t filter_idx, idx_t filter_col_idx) const {
	// generate a "OR" filter (i.e. x=1 OR x=535 OR x=997)
	// first scan the entire vector at the probe side
	// FIXME: this code is duplicated from PerfectHashJoinExecutor::FullScanHashTable
	auto build_idx = join_condition[filter_idx];
	auto &data_collection = ht.GetDataCollection();

	Vector tuples_addresses(LogicalType::POINTER, ht.Count()); // allocate space for all the tuples

	JoinHTScanState join_ht_state(data_collection, 0, data_collection.ChunkCount(),
	                              TupleDataPinProperties::KEEP_EVERYTHING_PINNED);

	// Go through all the blocks and fill the keys addresses
	idx_t key_count = ht.FillWithHTOffsets(join_ht_state, tuples_addresses);

	// Scan the build keys in the hash table
	Vector build_vector(ht.layout_ptr->GetTypes()[build_idx], key_count);
	data_collection.Gather(tuples_addresses, *FlatVector::IncrementalSelectionVector(), key_count, build_idx,
	                       build_vector, *FlatVector::IncrementalSelectionVector(), nullptr);

	// generate the OR-clause - note that we only need to consider unique values here (so we use a seT)
	value_set_t unique_ht_values;
	for (idx_t k = 0; k < key_count; k++) {
		unique_ht_values.insert(build_vector.GetValue(k));
	}
	vector<Value> in_list(unique_ht_values.begin(), unique_ht_values.end());

	// generating the OR filter only makes sense if the range is
	// not dense and that the range does not contain NULL
	// i.e. if we have the values [0, 1, 2, 3, 4] - the min/max is fully equivalent to the OR filter
	if (FilterCombiner::ContainsNull(in_list) || FilterCombiner::IsDenseRange(in_list)) {
		return;
	}

	// generate the OR filter
	auto in_filter = make_uniq<InFilter>(std::move(in_list));

	// we push the OR filter as an OptionalFilter so that we can use it for zonemap pruning only
	// the IN-list is expensive to execute otherwise
	auto filter = make_uniq<OptionalFilter>(std::move(in_filter));
	info.dynamic_filters->PushFilter(op, filter_col_idx, std::move(filter));
	return;
}